

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageEdgeCircumcenterSign<double>
              (Vector3<double> *x0,Vector3<double> *x1,Vector3<double> *a,Vector3<double> *b,
              Vector3<double> *c,int abc_sign)

{
  int iVar1;
  double dVar2;
  FloatType FVar3;
  FloatType FVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double z_error;
  double local_58;
  double dStack_50;
  double local_48;
  Vector3<double> z;
  
  GetCircumcenter<double>(&z,a,b,c,&z_error);
  dVar7 = x0->c_[1] - x1->c_[1];
  dVar8 = x0->c_[2] - x1->c_[2];
  dVar9 = x0->c_[1] + x1->c_[1];
  dVar2 = x0->c_[0] - x1->c_[0];
  dVar5 = x1->c_[2] + x0->c_[2];
  dVar6 = x1->c_[0] + x0->c_[0];
  local_58 = dVar7 * dVar5 - dVar8 * dVar9;
  dStack_50 = dVar8 * dVar6 - dVar2 * dVar5;
  local_48 = dVar2 * dVar9 - dVar6 * dVar7;
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)&local_58,(D *)&z);
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&z);
  FVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_58);
  dVar5 = FVar4 * z_error +
          (FVar4 * 3.3306690738754696e-16 +
          (FVar4 * 4.464101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16) * FVar3;
  iVar1 = 1;
  if (dVar2 * (double)abc_sign <= dVar5) {
    iVar1 = -(uint)(dVar2 * (double)abc_sign < -dVar5);
  }
  return iVar1;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}